

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledInputReadTile(ImfTiledInputFile *in,int dx,int dy,int lx,int ly)

{
  undefined4 in_ECX;
  ImfTiledInputFile *in_RDI;
  undefined4 in_R8D;
  exception *e;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  anon_unknown.dwarf_70604::infile(in_RDI);
  Imf_3_4::TiledRgbaInputFile::readTile
            ((TiledRgbaInputFile *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return 1;
}

Assistant:

int
ImfTiledInputReadTile (ImfTiledInputFile* in, int dx, int dy, int lx, int ly)
{
    try
    {
        infile (in)->readTile (dx, dy, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}